

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  uint *puVar1;
  uint uVar2;
  uv_stdio_container_t *puVar3;
  long lVar4;
  uv_stream_t *stream;
  int iVar5;
  __pid_t _Var6;
  int (*pipes) [2];
  long *plVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int (*fds) [2];
  ulong uVar12;
  ulong uVar13;
  int signal_pipe [2];
  int exec_errorno;
  undefined8 local_58;
  __pid_t local_50;
  int local_4c;
  uv_process_t *local_48;
  uv_loop_t *local_40;
  void **local_38;
  
  local_58 = 0xffffffffffffffff;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL","src/unix/process.c",0x16a,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x1f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,"src/unix/process.c",0x16f,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 0x2000;
  process->handle_queue[0] = loop->handle_queue;
  plVar7 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar7;
  *plVar7 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  local_38 = process->queue;
  process->queue[0] = local_38;
  process->queue[1] = local_38;
  uVar9 = options->stdio_count;
  uVar13 = 3;
  if (3 < (int)uVar9) {
    uVar13 = (ulong)uVar9;
  }
  local_40 = loop;
  pipes = (int (*) [2])malloc(uVar13 * 8);
  if (pipes == (int (*) [2])0x0) {
    return -0xc;
  }
  local_48 = process;
  memset(pipes,0xff,uVar13 * 8);
  if (0 < (int)uVar9) {
    lVar10 = 8;
    lVar11 = 0;
    fds = pipes;
    do {
      puVar3 = options->stdio;
      uVar2 = *(uint *)((long)puVar3 + lVar10 + -8);
      switch(uVar2 & 7) {
      case 0:
        break;
      case 1:
        lVar4 = *(long *)((long)&puVar3->flags + lVar10);
        if (lVar4 == 0) {
          __assert_fail("container->data.stream != NULL","src/unix/process.c",0xca,
                        "int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (*(int *)(lVar4 + 0x18) != 7) {
LAB_0010d786:
          iVar5 = -0x16;
          goto LAB_0010d7b0;
        }
        iVar5 = uv__make_socketpair(*fds,0);
        if (iVar5 != 0) goto LAB_0010d7b0;
        uVar9 = options->stdio_count;
        break;
      case 2:
      case 4:
        plVar7 = (long *)((long)&puVar3->flags + lVar10);
        if ((uVar2 & 2) == 0) {
          plVar7 = (long *)(*plVar7 + 0xa0);
        }
        if ((int)*plVar7 == -1) goto LAB_0010d786;
        (*fds)[1] = (int)*plVar7;
        break;
      default:
        __assert_fail("0 && \"Unexpected flags\"","src/unix/process.c",0xde,
                      "int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      lVar11 = lVar11 + 1;
      fds = fds + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar11 < (int)uVar9);
  }
  iVar5 = uv__make_pipe((int *)&local_58,0);
  if (iVar5 == 0) {
    uv_signal_start(&local_40->child_watcher,uv__chld,0x11);
    _Var6 = fork();
    if (_Var6 != -1) {
      if (_Var6 == 0) {
        uv__process_child_init(options,(int)uVar13,pipes,local_58._4_4_);
LAB_0010da19:
        __assert_fail("pid > 0","src/unix/process.c",0x2d,
                      "QUEUE *uv__process_queue(uv_loop_t *, int)");
      }
      uv__close(local_58._4_4_);
      local_48->status = 0;
      local_4c = 0;
      local_50 = _Var6;
      do {
        uVar12 = read((int)local_58,&local_4c,4);
        if (uVar12 != 0xffffffffffffffff) {
          if ((uVar12 & 0xfffffffffffffffb) == 0) goto LAB_0010d829;
          goto LAB_0010d781;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      if (*piVar8 != 0x20) {
LAB_0010d781:
        abort();
      }
LAB_0010d829:
      uv__close((int)local_58);
      iVar5 = options->stdio_count;
      if (0 < iVar5) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          puVar3 = options->stdio;
          if (((*(byte *)((long)&puVar3->flags + lVar10) & 1) != 0) && (-1 < pipes[lVar11][0])) {
            iVar5 = uv__close(pipes[lVar11][1]);
            if (iVar5 != 0) {
              piVar8 = __errno_location();
              if ((*piVar8 != 4) && (*piVar8 != 0x73)) goto LAB_0010d781;
            }
            pipes[lVar11][1] = -1;
            uv__nonblock(pipes[lVar11][0],1);
            stream = *(uv_stream_t **)((long)&puVar3->data + lVar10);
            if ((stream->type != UV_NAMED_PIPE) || (iVar5 = 0x60, *(int *)&stream[1].close_cb == 0))
            {
              iVar5 = (uint)(lVar10 == 0) * 0x20 + 0x20;
            }
            iVar5 = uv__stream_open(stream,pipes[lVar11][0],iVar5);
            if (iVar5 != 0) goto joined_r0x0010d95d;
            iVar5 = options->stdio_count;
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar11 < iVar5);
      }
      if (local_4c == 0) {
        if (local_50 < 1) goto LAB_0010da19;
        local_48->queue[0] = local_40->process_handles;
        plVar7 = (long *)local_40->process_handles[0][1];
        local_48->queue[1] = plVar7;
        *plVar7 = (long)local_38;
        local_40->process_handles[0][1] = local_38;
        uVar9 = local_48->flags;
        if (((uVar9 >> 0xe & 1) == 0) && (local_48->flags = uVar9 | 0x4000, (uVar9 >> 0xd & 1) != 0)
           ) {
          puVar1 = &local_48->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
      }
      local_48->pid = local_50;
      local_48->exit_cb = options->exit_cb;
      iVar5 = local_4c;
      goto LAB_0010d7f3;
    }
    piVar8 = __errno_location();
    iVar5 = -*piVar8;
    uv__close((int)local_58);
    uv__close(local_58._4_4_);
  }
LAB_0010d7b0:
  uVar12 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar12) ||
       ((options->stdio[uVar12].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar12][0] != -1) {
        close(pipes[uVar12][0]);
      }
      if (pipes[uVar12][1] != -1) {
        close(pipes[uVar12][1]);
      }
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != uVar13);
LAB_0010d7f3:
  free(pipes);
  return iVar5;
joined_r0x0010d95d:
  for (; lVar10 != 0; lVar10 = lVar10 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar10) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar10 + -8));
    }
  }
  goto LAB_0010d7b0;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
  int signal_pipe[2] = { -1, -1 };
  int (*pipes)[2];
  int stdio_count;
  QUEUE* q;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = -ENOMEM;
  pipes = malloc(stdio_count * sizeof(*pipes));
  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  pid = fork();

  if (pid == -1) {
    err = -errno;
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno))
    ; /* okay, read errorno */
  else if (r == -1 && errno == EPIPE)
    ; /* okay, got EPIPE */
  else
    abort();

  uv__close(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i], i == 0);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    q = uv__process_queue(loop, pid);
    QUEUE_INSERT_TAIL(q, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  free(pipes);
  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        close(pipes[i][0]);
      if (pipes[i][1] != -1)
        close(pipes[i][1]);
    }
    free(pipes);
  }

  return err;
}